

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O2

int arkode_butcher_order5d
              (sunrealtype *b,sunrealtype *c1,sunrealtype **A,sunrealtype *c2,sunrealtype *c3,int s)

{
  int iVar1;
  sunrealtype *z;
  sunrealtype *b_00;
  sunrealtype bcAcc;
  
  z = (sunrealtype *)calloc((long)s,8);
  b_00 = (sunrealtype *)calloc((long)s,8);
  iVar1 = arkode_butcher_vv(c2,c3,s,z);
  if (((iVar1 == 0) && (iVar1 = arkode_butcher_mv(A,z,s,b_00), iVar1 == 0)) &&
     (iVar1 = arkode_butcher_vv(b,c1,s,z), iVar1 == 0)) {
    iVar1 = arkode_butcher_dot(z,b_00,s,&bcAcc);
    if (iVar1 != 0) {
      return 0;
    }
    free(z);
    free(b_00);
    return (uint)(ABS(bcAcc + -0.06666666666666667) <= 1.4901161193847656e-08);
  }
  free(z);
  free(b_00);
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order5d(sunrealtype* b, sunrealtype* c1,
                                             sunrealtype** A, sunrealtype* c2,
                                             sunrealtype* c3, int s)
{
  sunrealtype bcAcc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_vv(c2, c3, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(b, c1, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(tmp1, tmp2, s, &bcAcc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bcAcc - SUN_RCONST(1.0) / SUN_RCONST(15.0)) > TOL) ? SUNFALSE
                                                                     : SUNTRUE;
}